

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::GetUnusedHeapBlock
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  undefined4 *puVar5;
  
  this_00 = this->emptyBlockList;
  if (this_00 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    this_00 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::New(this);
    if ((this->super_HeapBucket).emptyHeapBlockCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x2fd,"(this->emptyHeapBlockCount == 0)","this->emptyHeapBlockCount == 0")
      ;
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else {
    pSVar4 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                       (this_00);
    this->emptyBlockList = pSVar4;
    puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 - 1;
  }
  return this_00;
}

Assistant:

TBlockType*
HeapBucketT<TBlockType>::GetUnusedHeapBlock()
{
    // Add a new heap block
    TBlockType * heapBlock = emptyBlockList;
    if (heapBlock == nullptr)
    {
        // We couldn't find a reusable heap block
        heapBlock = TBlockType::New(this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->emptyHeapBlockCount == 0);
#endif
    }
    else
    {
        emptyBlockList = heapBlock->GetNextBlock();
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        this->emptyHeapBlockCount--;
#endif
    }
    return heapBlock;
}